

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O3

size_t masked_vbyte_read_loop(uint8_t *in,uint32_t *out,int len_signed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  uint32_t *out_00;
  uint64_t ints_read;
  uint64_t local_40;
  ulong local_38;
  
  uVar8 = (ulong)len_signed;
  if ((uint)len_signed < 0x61) {
    uVar4 = 0;
    uVar9 = 0;
    uVar11 = 0;
    sVar10 = 0;
  }
  else {
    auVar2 = *(undefined1 (*) [32])in;
    lVar7 = 0x30;
    uVar9 = 0;
    uVar11 = 0;
    sVar10 = 0;
    auVar1 = *(undefined1 (*) [16])(in + 0x20);
    local_38 = (ulong)CONCAT24((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar1[0xf] >> 7) << 0xf,
                               (uint)(SUB321(auVar2 >> 7,0) & 1) |
                               (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f);
    do {
      auVar2 = *(undefined1 (*) [32])(in + lVar7);
      uVar4 = lVar7 - 0x10;
      uVar9 = uVar9 | local_38 << ((ulong)(byte)(((char)lVar7 - (char)sVar10) - 0x30) & 0x3f);
      auVar1 = *(undefined1 (*) [16])(in + lVar7 + 0x20);
      lVar7 = lVar7 + 0x30;
      local_38 = (ulong)CONCAT24((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar1[0xf] >> 7) << 0xf,
                                 (uint)(SUB321(auVar2 >> 7,0) & 1) |
                                 (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                                 (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                                 (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                                 (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                                 (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                                 (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                                 (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                                 (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                                 (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                                 (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                                 (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                                 (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                                 (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                                 (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                                 (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                                 (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                                 (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                                 (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                                 (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                                 (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                                 (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                                 (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                                 (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                                 (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                                 (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                                 (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                                 (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                                 (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                                 (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                                 (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                                 (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f);
      while (sVar10 < uVar4) {
        uVar3 = masked_vbyte_read_group(in + sVar10,out + uVar11,uVar9,&local_40);
        uVar11 = uVar11 + local_40;
        uVar9 = uVar9 >> (uVar3 & 0x3f);
        sVar10 = sVar10 + uVar3;
        if (uVar9 == 0xffffffffffffffff) {
          return 0;
        }
      }
    } while (uVar11 + 0x70 < uVar8);
    uVar6 = (int)lVar7 - (int)sVar10;
    uVar4 = (ulong)uVar6;
    uVar9 = local_38 << ((ulong)(uVar6 - 0x30) & 0x3f) | uVar9;
  }
  lVar7 = (long)(int)uVar4;
  uVar5 = uVar11 + lVar7;
  if (uVar5 < uVar8) {
    do {
      uVar6 = (uint)uVar4;
      if ((int)uVar6 < 0x10) {
        if (uVar5 + 0x1f < uVar8) {
          auVar2 = *(undefined1 (*) [32])(in + sVar10 + lVar7);
          uVar4 = (ulong)((uint)(SUB321(auVar2 >> 7,0) & 1) |
                          (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                          (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                          (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                          (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                          (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                          (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                          (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                          (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                          (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                          (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                          (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                          (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                          (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                          (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                          (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                          (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                          (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                          (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                          (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                          (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                          (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                          (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                          (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                          (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                          (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                          (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                          (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                          (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                          (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                          (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                         (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f) << (uVar4 & 0x3f);
          uVar6 = uVar6 + 0x20;
        }
        else {
          if (uVar8 <= uVar5 + 0xf) break;
          auVar1 = vlddqu_avx(*(undefined1 (*) [16])(in + sVar10 + lVar7));
          uVar4 = (ulong)((uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                        (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) << (uVar6 & 0x1f));
          uVar6 = uVar6 + 0x10;
        }
        uVar9 = uVar9 | uVar4;
      }
      uVar3 = masked_vbyte_read_group(in + sVar10,out + uVar11,uVar9,&local_40);
      uVar11 = uVar11 + local_40;
      uVar6 = uVar6 - (int)uVar3;
      uVar4 = (ulong)uVar6;
      sVar10 = sVar10 + uVar3;
      uVar9 = uVar9 >> (uVar3 & 0x3f);
      lVar7 = (long)(int)uVar6;
      uVar5 = uVar11 + lVar7;
    } while (uVar5 < uVar8);
  }
  lVar7 = uVar8 - uVar11;
  if (uVar11 <= uVar8 && lVar7 != 0) {
    out_00 = out + uVar11;
    do {
      uVar6 = read_int(in + sVar10,out_00);
      sVar10 = sVar10 + uVar6;
      out_00 = out_00 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return sVar10;
}

Assistant:

size_t masked_vbyte_read_loop(const uint8_t *in, uint32_t *out,
                              int len_signed) {
  uint64_t length = (uint64_t)len_signed; // number of ints we want to decode
  size_t consumed = 0;                    // number of bytes read
  uint64_t count = 0; // how many integers we have read so far

  uint64_t sig = 0;
  int availablebytes = 0;
  if (96 < length) {
    size_t scanned = 0;

#ifdef __AVX2__
    __m256i low = _mm256_loadu_si256((__m256i *)(in + scanned));
    uint32_t lowSig = _mm256_movemask_epi8(low);
#else
    __m128i low1 = _mm_loadu_si128((__m128i *)(in + scanned));
    uint32_t lowSig1 = _mm_movemask_epi8(low1);
    __m128i low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
    uint32_t lowSig2 = _mm_movemask_epi8(low2);
    uint32_t lowSig = lowSig2 << 16;
    lowSig |= lowSig1;
#endif

    // excess verbosity to avoid problems with sign extension on conversions
    // better to think about what's happening and make it clearer
    __m128i high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
    uint32_t highSig = _mm_movemask_epi8(high);
    uint64_t nextSig = highSig;
    nextSig <<= 32;
    nextSig |= lowSig;
    scanned += 48;

    do {
      uint64_t thisSig = nextSig;

#ifdef __AVX2__
      low = _mm256_loadu_si256((__m256i *)(in + scanned));
      lowSig = _mm256_movemask_epi8(low);
#else
      low1 = _mm_loadu_si128((__m128i *)(in + scanned));
      lowSig1 = _mm_movemask_epi8(low1);
      low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
      lowSig2 = _mm_movemask_epi8(low2);
      lowSig = lowSig2 << 16;
      lowSig |= lowSig1;
#endif

      high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
      highSig = _mm_movemask_epi8(high);
      nextSig = highSig;
      nextSig <<= 32;
      nextSig |= lowSig;

      uint64_t remaining = scanned - (consumed + 48);
      sig = (thisSig << remaining) | sig;

      uint64_t reload = scanned - 16;
      scanned += 48;

      // need to reload when less than 16 scanned bytes remain in sig
      while (consumed < reload) {
        uint64_t ints_read;
        uint64_t bytes = masked_vbyte_read_group(in + consumed, out + count,
                                                 sig, &ints_read);
        sig >>= bytes;

        // seems like this might force the compiler to prioritize shifting sig
        // >>= bytes
        if (sig == 0xFFFFFFFFFFFFFFFF)
          return 0; // fake check to force earliest evaluation

        consumed += bytes;
        count += ints_read;
      }
    } while (count + 112 < length); // 112 == 48 + 48 ahead for scanning + up to
                                    // 16 remaining in sig
    sig = (nextSig << (scanned - consumed - 48)) | sig;
    availablebytes = (int)(scanned - consumed);
  }
  while (availablebytes + count < length) {
    if (availablebytes < 16) {
      if (availablebytes + count + 31 < length) {
#ifdef __AVX2__
        uint64_t newsigavx = (uint32_t)_mm256_movemask_epi8(
            _mm256_loadu_si256((__m256i *)(in + availablebytes + consumed)));
        sig |= (newsigavx << availablebytes);
#else
        uint64_t newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        uint64_t newsig2 = _mm_movemask_epi8(_mm_lddqu_si128(
            (const __m128i *)(in + availablebytes + 16 + consumed)));
        sig |= (newsig << availablebytes) | (newsig2 << (availablebytes + 16));
#endif
        availablebytes += 32;
      } else if (availablebytes + count + 15 < length) {
        int newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        sig |= newsig << availablebytes;
        availablebytes += 16;
      } else {
        break;
      }
    }
    uint64_t ints_read;

    uint64_t eaten =
        masked_vbyte_read_group(in + consumed, out + count, sig, &ints_read);
    consumed += eaten;
    availablebytes -= eaten;
    sig >>= eaten;
    count += ints_read;
  }
  for (; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}